

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RBBISetBuilder::buildRanges(RBBISetBuilder *this)

{
  UnicodeSet *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar32 where;
  UChar32 UVar4;
  int32_t iVar5;
  RangeDescriptor *this_00;
  void *obj;
  RBBINode *usetNode_00;
  char *in_RSI;
  RangeDescriptor *local_f8;
  UnicodeSet *inputSet_1;
  UnicodeString bofString;
  UnicodeString eofString;
  RangeDescriptor *rlSearchRange;
  UChar32 inputSetRangeEnd;
  UChar32 inputSetRangeBegin;
  int inputSetRangeIndex;
  int32_t inputSetRangeCount;
  UnicodeSet *inputSet;
  int ni;
  RangeDescriptor *local_20;
  RangeDescriptor *rlRange;
  RBBINode *usetNode;
  RBBISetBuilder *this_local;
  
  if (this->fRB->fDebugEnv != (char *)0x0) {
    in_RSI = "usets";
    strstr(this->fRB->fDebugEnv,"usets");
  }
  this_00 = (RangeDescriptor *)UMemory::operator_new((UMemory *)0x20,(size_t)in_RSI);
  local_f8 = (RangeDescriptor *)0x0;
  if (this_00 != (RangeDescriptor *)0x0) {
    RangeDescriptor::RangeDescriptor(this_00,this->fStatus);
    local_f8 = this_00;
  }
  this->fRangeList = local_f8;
  if (this->fRangeList == (RangeDescriptor *)0x0) {
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this->fRangeList->fStartChar = 0;
    this->fRangeList->fEndChar = 0x10ffff;
    UVar2 = ::U_FAILURE(*this->fStatus);
    if (UVar2 == '\0') {
      inputSet._0_4_ = 0;
      while (obj = UVector::elementAt(this->fRB->fUSetNodes,(int)inputSet), obj != (void *)0x0) {
        pUVar1 = *(UnicodeSet **)((long)obj + 0x20);
        iVar3 = UnicodeSet::getRangeCount(pUVar1);
        inputSetRangeEnd = 0;
        local_20 = this->fRangeList;
        while (inputSetRangeEnd < iVar3) {
          where = UnicodeSet::getRangeStart(pUVar1,inputSetRangeEnd);
          UVar4 = UnicodeSet::getRangeEnd(pUVar1,inputSetRangeEnd);
          for (; local_20->fEndChar < where; local_20 = local_20->fNext) {
          }
          if (local_20->fStartChar < where) {
            RangeDescriptor::split(local_20,where,this->fStatus);
            UVar2 = ::U_FAILURE(*this->fStatus);
            if (UVar2 != '\0') {
              return;
            }
          }
          else {
            if (UVar4 < local_20->fEndChar) {
              RangeDescriptor::split(local_20,UVar4 + 1,this->fStatus);
              UVar2 = ::U_FAILURE(*this->fStatus);
              if (UVar2 != '\0') {
                return;
              }
            }
            iVar5 = UVector::indexOf(local_20->fIncludesSets,obj,0);
            if (iVar5 == -1) {
              UVector::addElement(local_20->fIncludesSets,obj,this->fStatus);
              UVar2 = ::U_FAILURE(*this->fStatus);
              if (UVar2 != '\0') {
                return;
              }
            }
            if (UVar4 == local_20->fEndChar) {
              inputSetRangeEnd = inputSetRangeEnd + 1;
            }
            local_20 = local_20->fNext;
          }
        }
        inputSet._0_4_ = (int)inputSet + 1;
      }
      if (this->fRB->fDebugEnv != (char *)0x0) {
        strstr(this->fRB->fDebugEnv,"range");
      }
      for (local_20 = this->fRangeList; local_20 != (RangeDescriptor *)0x0;
          local_20 = local_20->fNext) {
        for (eofString.fUnion._48_8_ = this->fRangeList;
            (RangeDescriptor *)eofString.fUnion._48_8_ != local_20;
            eofString.fUnion._48_8_ = *(undefined8 *)(eofString.fUnion._48_8_ + 0x18)) {
          UVar2 = UVector::equals(local_20->fIncludesSets,
                                  *(UVector **)(eofString.fUnion._48_8_ + 0x10));
          if (UVar2 != '\0') {
            local_20->fNum = *(int32_t *)(eofString.fUnion._48_8_ + 8);
            break;
          }
        }
        if (local_20->fNum == 0) {
          this->fGroupCount = this->fGroupCount + 1;
          local_20->fNum = this->fGroupCount + 2;
          RangeDescriptor::setDictionaryFlag(local_20);
          addValToSets(this,local_20->fIncludesSets,this->fGroupCount + 2);
        }
      }
      UnicodeString::UnicodeString((UnicodeString *)((long)&bofString.fUnion + 0x30),L"eof");
      UnicodeString::UnicodeString((UnicodeString *)&inputSet_1,L"bof");
      inputSet._0_4_ = 0;
      while (usetNode_00 = (RBBINode *)UVector::elementAt(this->fRB->fUSetNodes,(int)inputSet),
            usetNode_00 != (RBBINode *)0x0) {
        pUVar1 = usetNode_00->fInputSet;
        UVar2 = UnicodeSet::contains(pUVar1,(UnicodeString *)((long)&bofString.fUnion + 0x30));
        if (UVar2 != '\0') {
          addValToSet(this,usetNode_00,1);
        }
        UVar2 = UnicodeSet::contains(pUVar1,(UnicodeString *)&inputSet_1);
        if (UVar2 != '\0') {
          addValToSet(this,usetNode_00,2);
          this->fSawBOF = '\x01';
        }
        inputSet._0_4_ = (int)inputSet + 1;
      }
      if (this->fRB->fDebugEnv != (char *)0x0) {
        strstr(this->fRB->fDebugEnv,"rgroup");
      }
      if (this->fRB->fDebugEnv != (char *)0x0) {
        strstr(this->fRB->fDebugEnv,"esets");
      }
      UnicodeString::~UnicodeString((UnicodeString *)&inputSet_1);
      UnicodeString::~UnicodeString((UnicodeString *)((long)&bofString.fUnion + 0x30));
    }
  }
  return;
}

Assistant:

void RBBISetBuilder::buildRanges() {
    RBBINode        *usetNode;
    RangeDescriptor *rlRange;

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "usets")) {printSets();}

    //
    //  Initialize the process by creating a single range encompassing all characters
    //  that is in no sets.
    //
    fRangeList                = new RangeDescriptor(*fStatus); // will check for status here
    if (fRangeList == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fRangeList->fStartChar    = 0;
    fRangeList->fEndChar      = 0x10ffff;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //
    //  Find the set of non-overlapping ranges of characters
    //
    int  ni;
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }

        UnicodeSet      *inputSet             = usetNode->fInputSet;
        int32_t          inputSetRangeCount   = inputSet->getRangeCount();
        int              inputSetRangeIndex   = 0;
                         rlRange              = fRangeList;

        for (;;) {
            if (inputSetRangeIndex >= inputSetRangeCount) {
                break;
            }
            UChar32      inputSetRangeBegin  = inputSet->getRangeStart(inputSetRangeIndex);
            UChar32      inputSetRangeEnd    = inputSet->getRangeEnd(inputSetRangeIndex);

            // skip over ranges from the range list that are completely
            //   below the current range from the input unicode set.
            while (rlRange->fEndChar < inputSetRangeBegin) {
                rlRange = rlRange->fNext;
            }

            // If the start of the range from the range list is before with
            //   the start of the range from the unicode set, split the range list range
            //   in two, with one part being before (wholly outside of) the unicode set
            //   and the other containing the rest.
            //   Then continue the loop; the post-split current range will then be skipped
            //     over
            if (rlRange->fStartChar < inputSetRangeBegin) {
                rlRange->split(inputSetRangeBegin, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
                continue;
            }

            // Same thing at the end of the ranges...
            // If the end of the range from the range list doesn't coincide with
            //   the end of the range from the unicode set, split the range list
            //   range in two.  The first part of the split range will be
            //   wholly inside the Unicode set.
            if (rlRange->fEndChar > inputSetRangeEnd) {
                rlRange->split(inputSetRangeEnd+1, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // The current rlRange is now entirely within the UnicodeSet range.
            // Add this unicode set to the list of sets for this rlRange
            if (rlRange->fIncludesSets->indexOf(usetNode) == -1) {
                rlRange->fIncludesSets->addElement(usetNode, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // Advance over ranges that we are finished with.
            if (inputSetRangeEnd == rlRange->fEndChar) {
                inputSetRangeIndex++;
            }
            rlRange = rlRange->fNext;
        }
    }

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "range")) { printRanges();}

    //
    //  Group the above ranges, with each group consisting of one or more
    //    ranges that are in exactly the same set of original UnicodeSets.
    //    The groups are numbered, and these group numbers are the set of
    //    input symbols recognized by the run-time state machine.
    //
    //    Numbering: # 0  (state table column 0) is unused.
    //               # 1  is reserved - table column 1 is for end-of-input
    //               # 2  is reserved - table column 2 is for beginning-in-input
    //               # 3  is the first range list.
    //
    RangeDescriptor *rlSearchRange;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        for (rlSearchRange=fRangeList; rlSearchRange != rlRange; rlSearchRange=rlSearchRange->fNext) {
            if (rlRange->fIncludesSets->equals(*rlSearchRange->fIncludesSets)) {
                rlRange->fNum = rlSearchRange->fNum;
                break;
            }
        }
        if (rlRange->fNum == 0) {
            fGroupCount ++;
            rlRange->fNum = fGroupCount+2; 
            rlRange->setDictionaryFlag();
            addValToSets(rlRange->fIncludesSets, fGroupCount+2);
        }
    }

    // Handle input sets that contain the special string {eof}.
    //   Column 1 of the state table is reserved for EOF on input.
    //   Column 2 is reserved for before-the-start-input.
    //            (This column can be optimized away later if there are no rule
    //             references to {bof}.)
    //   Add this column value (1 or 2) to the equivalent expression
    //     subtree for each UnicodeSet that contains the string {eof}
    //   Because {bof} and {eof} are not a characters in the normal sense,
    //   they doesn't affect the computation of ranges or TRIE.
    static const UChar eofUString[] = {0x65, 0x6f, 0x66, 0};
    static const UChar bofUString[] = {0x62, 0x6f, 0x66, 0};

    UnicodeString eofString(eofUString);
    UnicodeString bofString(bofUString);
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }
        UnicodeSet      *inputSet = usetNode->fInputSet;
        if (inputSet->contains(eofString)) {
            addValToSet(usetNode, 1);
        }
        if (inputSet->contains(bofString)) {
            addValToSet(usetNode, 2);
            fSawBOF = TRUE;
        }
    }


    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rgroup")) {printRangeGroups();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "esets")) {printSets();}
}